

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,unsigned_long *args,
          _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
          *args_1)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_1a8 [376];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  format<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
            ((ostream *)aoStack_1a8,(char *)this,(unsigned_long *)fmt,
             (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
              *)args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}